

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_textedit_find_charpos
               (nk_text_find *find,nk_text_edit *state,int n,int single_line,nk_user_font *font,
               float row_height)

{
  int iVar1;
  float fVar2;
  int local_50;
  int first;
  int i;
  int z;
  int prev_start;
  nk_text_edit_row r;
  float row_height_local;
  nk_user_font *font_local;
  int single_line_local;
  int n_local;
  nk_text_edit *state_local;
  nk_text_find *find_local;
  
  i = 0;
  iVar1 = (state->string).len;
  local_50 = 0;
  r.ymax = row_height;
  unique0x10000155 = font;
  nk_zero(&z,0x18);
  if (n == iVar1) {
    nk_textedit_layout_row((nk_text_edit_row *)&z,state,0,r.ymax,stack0xffffffffffffffd8);
    if (single_line == 0) {
      while (local_50 < iVar1) {
        i = local_50;
        local_50 = (int)r.ymin + local_50;
        nk_textedit_layout_row((nk_text_edit_row *)&z,state,local_50,r.ymax,stack0xffffffffffffffd8)
        ;
      }
      find->first_char = local_50;
      find->length = (int)r.ymin;
    }
    else {
      find->first_char = 0;
      find->length = iVar1;
    }
    find->x = (float)prev_start;
    find->y = r.x1;
    find->height = r.baseline_y_delta - r.x1;
    find->prev_first = i;
  }
  else {
    find->y = 0.0;
    while (iVar1 = local_50,
          nk_textedit_layout_row
                    ((nk_text_edit_row *)&z,state,local_50,r.ymax,stack0xffffffffffffffd8),
          local_50 + (int)r.ymin <= n) {
      i = local_50;
      local_50 = (int)r.ymin + local_50;
      find->y = r.x0 + find->y;
    }
    find->first_char = local_50;
    find->length = (int)r.ymin;
    find->height = r.baseline_y_delta - r.x1;
    find->prev_first = i;
    find->x = (float)z;
    for (local_50 = 0; iVar1 + local_50 < n; local_50 = local_50 + 1) {
      fVar2 = nk_textedit_get_width(state,iVar1,local_50,stack0xffffffffffffffd8);
      find->x = fVar2 + find->x;
    }
  }
  return;
}

Assistant:

NK_INTERN void
nk_textedit_find_charpos(struct nk_text_find *find, struct nk_text_edit *state,
    int n, int single_line, const struct nk_user_font *font, float row_height)
{
    /* find the x/y location of a character, and remember info about the previous
     * row in case we get a move-up event (for page up, we'll have to rescan) */
    struct nk_text_edit_row r;
    int prev_start = 0;
    int z = state->string.len;
    int i=0, first;

    nk_zero_struct(r);
    if (n == z) {
        /* if it's at the end, then find the last line -- simpler than trying to
        explicitly handle this case in the regular code */
        nk_textedit_layout_row(&r, state, 0, row_height, font);
        if (single_line) {
            find->first_char = 0;
            find->length = z;
        } else {
            while (i < z) {
                prev_start = i;
                i += r.num_chars;
                nk_textedit_layout_row(&r, state, i, row_height, font);
            }

            find->first_char = i;
            find->length = r.num_chars;
        }
        find->x = r.x1;
        find->y = r.ymin;
        find->height = r.ymax - r.ymin;
        find->prev_first = prev_start;
        return;
    }

    /* search rows to find the one that straddles character n */
    find->y = 0;

    for(;;) {
        nk_textedit_layout_row(&r, state, i, row_height, font);
        if (n < i + r.num_chars) break;
        prev_start = i;
        i += r.num_chars;
        find->y += r.baseline_y_delta;
    }

    find->first_char = first = i;
    find->length = r.num_chars;
    find->height = r.ymax - r.ymin;
    find->prev_first = prev_start;

    /* now scan to find xpos */
    find->x = r.x0;
    for (i=0; first+i < n; ++i)
        find->x += nk_textedit_get_width(state, first, i, font);
}